

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O1

fvar<double,_2UL> * __thiscall
ising::free_energy::triangular::
infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (fvar<double,_2UL> *__return_storage_ptr__,triangular *this,double Ja,double Jb,double Jc,
          fvar<double,_2UL> beta)

{
  uint uVar1;
  fvar<double,_2UL> beta_00;
  char cVar2;
  size_t i;
  long lVar3;
  ostream *poVar4;
  invalid_argument *this_00;
  size_t i_18;
  long lVar5;
  _anonymous_namespace_ *p_Var6;
  double *pdVar7;
  size_t i_38;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> *pfVar8;
  _anonymous_namespace_ *p_Var9;
  int j;
  int iVar10;
  ulong uVar11;
  int j_2;
  int iVar12;
  ulong uVar13;
  _anonymous_namespace_ *this_01;
  long lVar14;
  _anonymous_namespace_ *p_Var15;
  double *pdVar16;
  size_t i_41;
  unsigned_long j_8;
  ulong uVar17;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> *this_02;
  bool bVar18;
  double dVar19;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval;
  fvar<double,_2UL> pz;
  result_t g_1;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_3;
  fvar<double,_2UL> retval_14;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_33;
  fvar<double,_2UL> pe;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_34;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_17;
  fvar<double,_2UL> local_1b8;
  double local_1a0;
  double local_198 [4];
  double local_178 [4];
  fvar<double,_2UL> local_158;
  double local_138;
  double dStack_130;
  double local_128;
  _anonymous_namespace_ local_120 [8];
  fvar<double,_2UL> local_118;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *local_100;
  double local_f8 [4];
  fvar<double,_2UL> local_d8;
  double local_c0;
  double local_b8;
  double local_b0;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> local_a8;
  double *local_38;
  
  local_c0 = Ja;
  local_b8 = Jb;
  local_b0 = Jc;
  if (Ja * Jb * Jc <= 0.0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Ja * Jb * Jc should be positive");
  }
  else {
    if (0.0 < beta.v._M_elems[0]) {
      (anonymous_namespace)::
      func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                (&local_a8,(_anonymous_namespace_ *)this,Ja,Jb,Jc,beta);
      local_198[0] = 0.0;
      local_198[1] = 0.0;
      local_198[2] = 0.0;
      anon_unknown_4::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&local_158,&local_a8,0.0,0.0);
      anon_unknown_4::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&local_118,&local_a8,0.0,6.283185307179586);
      lVar3 = 0;
      do {
        local_1b8.v._M_elems[lVar3] = local_158.v._M_elems[lVar3] + local_118.v._M_elems[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      local_38 = (double *)__return_storage_ptr__;
      lVar3 = 0;
      do {
        local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      iVar10 = 0;
      do {
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_1b8,&local_a8,0.0,
                   (double)(iVar10 * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0);
        local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 4.0;
        if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
          local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 4.0;
        }
        if (local_1b8.v._M_elems[2] != 0.0) {
          local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 4.0;
        }
        lVar3 = 0;
        do {
          local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 8);
      iVar10 = 1;
      local_1a0 = 1.0;
      do {
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_1b8,&local_a8,0.0,local_1a0 * 0.7853981633974483 + 0.0);
        local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] + local_1b8.v._M_elems[0];
        if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
          local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] + local_1b8.v._M_elems[1];
        }
        if (local_1b8.v._M_elems[2] != 0.0) {
          local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] + local_1b8.v._M_elems[2];
        }
        lVar3 = 0;
        do {
          local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_1a0 = local_1a0 + 1.0;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 8);
      iVar10 = 0;
      do {
        local_1a0 = (double)(iVar10 * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0;
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_118,&local_a8,local_1a0,0.0);
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_d8,&local_a8,local_1a0,6.283185307179586);
        lVar3 = 0;
        do {
          local_158.v._M_elems[lVar3] = local_118.v._M_elems[lVar3] + local_d8.v._M_elems[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_1b8.v._M_elems[1] = local_158.v._M_elems[1];
        local_1b8.v._M_elems[2] = local_158.v._M_elems[2];
        local_1b8.v._M_elems[0] = local_158.v._M_elems[0] * 4.0;
        if ((local_158.v._M_elems[1] != 0.0) || (NAN(local_158.v._M_elems[1]))) {
          local_1b8.v._M_elems[1] = local_158.v._M_elems[1] * 4.0;
        }
        if (local_158.v._M_elems[2] != 0.0) {
          local_1b8.v._M_elems[2] = local_158.v._M_elems[2] * 4.0;
        }
        lVar3 = 0;
        do {
          local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        iVar12 = 0;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1b8,&local_a8,local_1a0,
                     (double)(iVar12 * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0);
          local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 16.0;
          if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
            local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 16.0;
          }
          if (local_1b8.v._M_elems[2] != 0.0) {
            local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 16.0;
          }
          lVar3 = 0;
          do {
            local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          iVar12 = iVar12 + 1;
        } while (iVar12 != 8);
        iVar12 = 1;
        dVar19 = 1.0;
        do {
          local_198[3] = dVar19;
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1b8,&local_a8,local_1a0,dVar19 * 0.7853981633974483 + 0.0);
          local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 8.0;
          if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
            local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 8.0;
          }
          if (local_1b8.v._M_elems[2] != 0.0) {
            local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 8.0;
          }
          lVar3 = 0;
          do {
            local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          dVar19 = local_198[3] + 1.0;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 8);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 8);
      iVar10 = 1;
      dVar19 = 1.0;
      do {
        local_1a0 = dVar19 * 0.7853981633974483 + 0.0;
        local_100 = (promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)dVar19;
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_118,&local_a8,local_1a0,0.0);
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_d8,&local_a8,local_1a0,6.283185307179586);
        lVar3 = 0;
        do {
          local_158.v._M_elems[lVar3] = local_118.v._M_elems[lVar3] + local_d8.v._M_elems[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_1b8.v._M_elems[1] = local_158.v._M_elems[1];
        local_1b8.v._M_elems[2] = local_158.v._M_elems[2];
        local_1b8.v._M_elems[0] = local_158.v._M_elems[0] + local_158.v._M_elems[0];
        if ((local_158.v._M_elems[1] != 0.0) || (NAN(local_158.v._M_elems[1]))) {
          local_1b8.v._M_elems[1] = local_158.v._M_elems[1] + local_158.v._M_elems[1];
        }
        if (local_158.v._M_elems[2] != 0.0) {
          local_1b8.v._M_elems[2] = local_158.v._M_elems[2] + local_158.v._M_elems[2];
        }
        lVar3 = 0;
        do {
          local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        iVar12 = 0;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1b8,&local_a8,local_1a0,
                     (double)(iVar12 * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0);
          local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 8.0;
          if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
            local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 8.0;
          }
          if (local_1b8.v._M_elems[2] != 0.0) {
            local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 8.0;
          }
          lVar3 = 0;
          do {
            local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          iVar12 = iVar12 + 1;
        } while (iVar12 != 8);
        iVar12 = 1;
        dVar19 = 1.0;
        do {
          local_198[3] = dVar19;
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1b8,&local_a8,local_1a0,dVar19 * 0.7853981633974483 + 0.0);
          local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 4.0;
          if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
            local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 4.0;
          }
          if (local_1b8.v._M_elems[2] != 0.0) {
            local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 4.0;
          }
          lVar3 = 0;
          do {
            local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          dVar19 = local_198[3] + 1.0;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 8);
        dVar19 = (double)local_100 + 1.0;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 8);
      anon_unknown_4::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&local_158,&local_a8,6.283185307179586,0.0);
      anon_unknown_4::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&local_118,&local_a8,6.283185307179586,6.283185307179586);
      lVar3 = 0;
      do {
        local_1b8.v._M_elems[lVar3] = local_158.v._M_elems[lVar3] + local_118.v._M_elems[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar3 = 0;
      do {
        local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      iVar10 = 0;
      do {
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_1b8,&local_a8,6.283185307179586,
                   (double)(iVar10 * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0);
        local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 4.0;
        if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
          local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 4.0;
        }
        if (local_1b8.v._M_elems[2] != 0.0) {
          local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 4.0;
        }
        lVar3 = 0;
        do {
          local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 8);
      iVar10 = 1;
      dVar19 = 1.0;
      this_02 = &local_a8;
      do {
        local_1a0 = dVar19;
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_1b8,this_02,6.283185307179586,dVar19 * 0.7853981633974483 + 0.0);
        local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] + local_1b8.v._M_elems[0];
        if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
          local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] + local_1b8.v._M_elems[1];
        }
        if (local_1b8.v._M_elems[2] != 0.0) {
          local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] + local_1b8.v._M_elems[2];
        }
        lVar3 = 0;
        do {
          local_198[lVar3] = local_1b8.v._M_elems[lVar3] + local_198[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        dVar19 = local_1a0 + 1.0;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 8);
      if ((local_198[1] != 0.0) || (NAN(local_198[1]))) {
        local_198[1] = local_198[1] * 0.01713472986300236;
      }
      if (local_198[2] != 0.0) {
        local_198[2] = local_198[2] * 0.01713472986300236;
      }
      dStack_130 = local_198[1];
      local_128 = local_198[2];
      local_138 = local_198[0] * 0.01713472986300236 + 0.6931471805599453;
      local_198[0] = local_138;
      local_100 = &retval;
      lVar3 = 2;
      lVar5 = 0;
      pdVar7 = (double *)&beta;
      do {
        if ((fvar<double,_2UL> *)((long)&retval + lVar3 * -8) == &beta) {
          dVar19 = 0.0;
        }
        else {
          dVar19 = 0.0;
          lVar14 = 0;
          pdVar16 = (double *)&beta;
          do {
            dVar19 = dVar19 + *pdVar16 * *(double *)((long)pdVar7 + lVar14);
            pdVar16 = pdVar16 + 1;
            lVar14 = lVar14 + -8;
          } while (lVar3 * 8 + -0x18 != lVar14);
        }
        local_158.v._M_elems[lVar5] = dVar19;
        lVar5 = lVar5 + 1;
        bVar18 = lVar3 == 0;
        lVar3 = lVar3 + -1;
        if (bVar18) {
          lVar3 = 0;
        }
        pdVar7 = pdVar7 + 1;
      } while (lVar5 != 3);
      dVar19 = local_198[2] + local_198[2];
      local_1b8.v._M_elems[1] = local_158.v._M_elems[1];
      local_1b8.v._M_elems[2] = local_158.v._M_elems[2];
      local_1b8.v._M_elems[0] = local_158.v._M_elems[0] * dVar19;
      if ((local_158.v._M_elems[1] != 0.0) || (NAN(local_158.v._M_elems[1]))) {
        local_1b8.v._M_elems[1] = dVar19 * local_158.v._M_elems[1];
      }
      if (local_158.v._M_elems[2] != 0.0) {
        local_1b8.v._M_elems[2] = dVar19 * local_158.v._M_elems[2];
      }
      local_f8[0] = (local_158.v._M_elems[0] * dVar19) / local_138;
      local_a8.c_ = local_f8[0];
      lVar3 = 1;
      p_Var6 = (_anonymous_namespace_ *)&local_128;
      do {
        dVar19 = 0.0;
        this_01 = (_anonymous_namespace_ *)&dStack_130;
        pfVar8 = this_02;
        do {
          dVar19 = dVar19 + *(double *)this_01 * pfVar8->c_;
          this_01 = this_01 + 8;
          pfVar8 = (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)(pfVar8[-1].cshabc_.v._M_elems + 2);
        } while (this_01 != p_Var6);
        local_a8.sh2a_.v._M_elems[lVar3 + -1] = (local_1b8.v._M_elems[lVar3] - dVar19) / local_138;
        lVar3 = lVar3 + 1;
        this_02 = (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                   *)&this_02->sh2a_;
        p_Var6 = local_120;
      } while (lVar3 != 3);
      if (0.0 <= local_f8[0]) {
        if ((local_f8[0] != 0.0) || (NAN(local_f8[0]))) {
          local_f8[2] = local_a8.sh2a_.v._M_elems[1];
          local_f8[1] = local_a8.sh2a_.v._M_elems[0];
        }
        else {
          local_f8[0] = 0.0;
          local_f8[1] = 0.0;
          local_f8[2] = 0.0;
        }
      }
      else {
        local_f8[2] = local_a8.sh2a_.v._M_elems[1];
        local_f8[1] = local_a8.sh2a_.v._M_elems[0];
        lVar3 = 0;
        do {
          *(ulong *)((long)local_f8 + lVar3) =
               *(ulong *)((long)local_f8 + lVar3) ^ 0x8000000000000000;
          lVar3 = lVar3 + 8;
        } while (lVar3 != 0x18);
      }
      uVar11 = 0x10;
      do {
        beta_00.v._M_elems[1] = beta.v._M_elems[1];
        beta_00.v._M_elems[0] = beta.v._M_elems[0];
        beta_00.v._M_elems[2] = beta.v._M_elems[2];
        local_198[0] = local_138;
        local_198[1] = dStack_130;
        local_198[2] = local_128;
        (anonymous_namespace)::
        func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                  (&local_a8,this_01,local_c0,local_b8,local_b0,beta_00);
        local_178[0] = 0.0;
        local_178[1] = 0.0;
        local_178[2] = 0.0;
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_158,&local_a8,0.0,0.0);
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_118,&local_a8,0.0,6.283185307179586);
        lVar3 = 0;
        do {
          local_1b8.v._M_elems[lVar3] = local_158.v._M_elems[lVar3] + local_118.v._M_elems[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        lVar3 = 0;
        do {
          local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_1a0 = 6.283185307179586 / (double)(long)uVar11;
        uVar17 = 0;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1b8,&local_a8,0.0,(double)(long)(uVar17 * 2 + 1) * local_1a0 * 0.5 + 0.0
                    );
          local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 4.0;
          if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
            local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 4.0;
          }
          if (local_1b8.v._M_elems[2] != 0.0) {
            local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 4.0;
          }
          lVar3 = 0;
          do {
            local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar11);
        uVar17 = 1;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1b8,&local_a8,0.0,(double)(long)uVar17 * local_1a0 + 0.0);
          local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] + local_1b8.v._M_elems[0];
          if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
            local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] + local_1b8.v._M_elems[1];
          }
          if (local_1b8.v._M_elems[2] != 0.0) {
            local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] + local_1b8.v._M_elems[2];
          }
          lVar3 = 0;
          do {
            local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar11);
        uVar17 = 0;
        do {
          local_198[3] = (double)(long)(uVar17 * 2 + 1) * local_1a0 * 0.5 + 0.0;
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_118,&local_a8,local_198[3],0.0);
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_d8,&local_a8,local_198[3],6.283185307179586);
          lVar3 = 0;
          do {
            local_158.v._M_elems[lVar3] = local_118.v._M_elems[lVar3] + local_d8.v._M_elems[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          local_1b8.v._M_elems[1] = local_158.v._M_elems[1];
          local_1b8.v._M_elems[2] = local_158.v._M_elems[2];
          local_1b8.v._M_elems[0] = local_158.v._M_elems[0] * 4.0;
          if ((local_158.v._M_elems[1] != 0.0) || (NAN(local_158.v._M_elems[1]))) {
            local_1b8.v._M_elems[1] = local_158.v._M_elems[1] * 4.0;
          }
          if (local_158.v._M_elems[2] != 0.0) {
            local_1b8.v._M_elems[2] = local_158.v._M_elems[2] * 4.0;
          }
          lVar3 = 0;
          do {
            local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar13 = 0;
          do {
            anon_unknown_4::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&local_1b8,&local_a8,local_198[3],
                       (double)(long)(uVar13 * 2 + 1) * local_1a0 * 0.5 + 0.0);
            local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 16.0;
            if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
              local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 16.0;
            }
            if (local_1b8.v._M_elems[2] != 0.0) {
              local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 16.0;
            }
            lVar3 = 0;
            do {
              local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar11);
          uVar13 = 1;
          do {
            anon_unknown_4::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&local_1b8,&local_a8,local_198[3],(double)(long)uVar13 * local_1a0 + 0.0);
            local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 8.0;
            if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
              local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 8.0;
            }
            if (local_1b8.v._M_elems[2] != 0.0) {
              local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 8.0;
            }
            lVar3 = 0;
            do {
              local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar11);
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar11);
        uVar17 = 1;
        do {
          local_198[3] = (double)(long)uVar17 * local_1a0 + 0.0;
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_118,&local_a8,local_198[3],0.0);
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_d8,&local_a8,local_198[3],6.283185307179586);
          lVar3 = 0;
          do {
            local_158.v._M_elems[lVar3] = local_118.v._M_elems[lVar3] + local_d8.v._M_elems[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          local_1b8.v._M_elems[1] = local_158.v._M_elems[1];
          local_1b8.v._M_elems[2] = local_158.v._M_elems[2];
          local_1b8.v._M_elems[0] = local_158.v._M_elems[0] + local_158.v._M_elems[0];
          if ((local_158.v._M_elems[1] != 0.0) || (NAN(local_158.v._M_elems[1]))) {
            local_1b8.v._M_elems[1] = local_158.v._M_elems[1] + local_158.v._M_elems[1];
          }
          if (local_158.v._M_elems[2] != 0.0) {
            local_1b8.v._M_elems[2] = local_158.v._M_elems[2] + local_158.v._M_elems[2];
          }
          lVar3 = 0;
          do {
            local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar13 = 0;
          do {
            anon_unknown_4::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&local_1b8,&local_a8,local_198[3],
                       (double)(long)(uVar13 * 2 + 1) * local_1a0 * 0.5 + 0.0);
            local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 8.0;
            if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
              local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 8.0;
            }
            if (local_1b8.v._M_elems[2] != 0.0) {
              local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 8.0;
            }
            lVar3 = 0;
            do {
              local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar11);
          uVar13 = 1;
          do {
            anon_unknown_4::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&local_1b8,&local_a8,local_198[3],(double)(long)uVar13 * local_1a0 + 0.0);
            local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 4.0;
            if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
              local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 4.0;
            }
            if (local_1b8.v._M_elems[2] != 0.0) {
              local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 4.0;
            }
            lVar3 = 0;
            do {
              local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 3);
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar11);
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar11);
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_158,&local_a8,6.283185307179586,0.0);
        anon_unknown_4::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_118,&local_a8,6.283185307179586,6.283185307179586);
        lVar3 = 0;
        do {
          local_1b8.v._M_elems[lVar3] = local_158.v._M_elems[lVar3] + local_118.v._M_elems[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        lVar3 = 0;
        do {
          local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        uVar17 = 0;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1b8,&local_a8,6.283185307179586,
                     (double)(long)(uVar17 * 2 + 1) * local_1a0 * 0.5 + 0.0);
          local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] * 4.0;
          if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
            local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] * 4.0;
          }
          if (local_1b8.v._M_elems[2] != 0.0) {
            local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] * 4.0;
          }
          lVar3 = 0;
          do {
            local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar11);
        uVar17 = 1;
        do {
          anon_unknown_4::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_1b8,&local_a8,6.283185307179586,(double)(long)uVar17 * local_1a0 + 0.0);
          local_1b8.v._M_elems[0] = local_1b8.v._M_elems[0] + local_1b8.v._M_elems[0];
          if ((local_1b8.v._M_elems[1] != 0.0) || (NAN(local_1b8.v._M_elems[1]))) {
            local_1b8.v._M_elems[1] = local_1b8.v._M_elems[1] + local_1b8.v._M_elems[1];
          }
          if (local_1b8.v._M_elems[2] != 0.0) {
            local_1b8.v._M_elems[2] = local_1b8.v._M_elems[2] + local_1b8.v._M_elems[2];
          }
          lVar3 = 0;
          do {
            local_178[lVar3] = local_1b8.v._M_elems[lVar3] + local_178[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar11);
        dVar19 = (local_1a0 * local_1a0) / 36.0;
        local_178[0] = local_178[0] * dVar19;
        if ((local_178[1] != 0.0) || (NAN(local_178[1]))) {
          local_178[1] = dVar19 * local_178[1];
        }
        if (local_178[2] != 0.0) {
          local_178[2] = dVar19 * local_178[2];
        }
        dStack_130 = local_178[1];
        local_128 = local_178[2];
        local_138 = local_178[0] + 0.6931471805599453;
        lVar3 = 2;
        lVar5 = 0;
        pdVar7 = (double *)&beta;
        do {
          if ((fvar<double,_2UL> *)((long)local_100 + lVar3 * -8) == &beta) {
            dVar19 = 0.0;
          }
          else {
            dVar19 = 0.0;
            lVar14 = 0;
            pdVar16 = (double *)&beta;
            do {
              dVar19 = dVar19 + *pdVar16 * *(double *)((long)pdVar7 + lVar14);
              pdVar16 = pdVar16 + 1;
              lVar14 = lVar14 + -8;
            } while (lVar3 * 8 + -0x18 != lVar14);
          }
          local_118.v._M_elems[lVar5] = dVar19;
          lVar5 = lVar5 + 1;
          bVar18 = lVar3 == 0;
          lVar3 = lVar3 + -1;
          if (bVar18) {
            lVar3 = 0;
          }
          pdVar7 = pdVar7 + 1;
        } while (lVar5 != 3);
        lVar3 = 0;
        do {
          local_d8.v._M_elems[lVar3] = (&local_138)[lVar3] - local_198[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        dVar19 = local_d8.v._M_elems[2] + local_d8.v._M_elems[2];
        local_158.v._M_elems[1] = local_118.v._M_elems[1];
        local_158.v._M_elems[2] = local_118.v._M_elems[2];
        local_158.v._M_elems[0] = local_118.v._M_elems[0] * dVar19;
        if ((local_118.v._M_elems[1] != 0.0) || (NAN(local_118.v._M_elems[1]))) {
          local_158.v._M_elems[1] = dVar19 * local_118.v._M_elems[1];
        }
        if (local_118.v._M_elems[2] != 0.0) {
          local_158.v._M_elems[2] = dVar19 * local_118.v._M_elems[2];
        }
        local_a8.c_ = (local_118.v._M_elems[0] * dVar19) / local_138;
        local_1b8.v._M_elems[0] = local_a8.c_;
        lVar3 = 1;
        p_Var6 = (_anonymous_namespace_ *)&local_1b8;
        p_Var9 = (_anonymous_namespace_ *)&local_128;
        do {
          dVar19 = 0.0;
          p_Var15 = (_anonymous_namespace_ *)&dStack_130;
          this_01 = p_Var6;
          do {
            dVar19 = dVar19 + *(double *)p_Var15 * *(double *)this_01;
            p_Var15 = p_Var15 + 8;
            this_01 = this_01 + -8;
          } while (p_Var15 != p_Var9);
          local_1b8.v._M_elems[lVar3] = (local_158.v._M_elems[lVar3] - dVar19) / local_138;
          lVar3 = lVar3 + 1;
          p_Var6 = p_Var6 + 8;
          p_Var9 = local_120;
        } while (lVar3 != 3);
        if (0.0 <= local_a8.c_) {
          if ((local_a8.c_ != 0.0) || (NAN(local_a8.c_))) {
            local_a8.sh2a_.v._M_elems[1] = local_1b8.v._M_elems[2];
            local_a8.sh2a_.v._M_elems[0] = local_1b8.v._M_elems[1];
          }
          else {
            local_a8.c_ = 0.0;
            local_a8.sh2a_.v._M_elems[0] = 0.0;
            local_a8.sh2a_.v._M_elems[1] = 0.0;
          }
        }
        else {
          local_a8.sh2a_.v._M_elems[1] = local_1b8.v._M_elems[2];
          local_a8.sh2a_.v._M_elems[0] = local_1b8.v._M_elems[1];
          lVar3 = 0;
          do {
            uVar1 = *(uint *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -4);
            *(undefined4 *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -8) =
                 *(undefined4 *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -8);
            *(uint *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -4) = uVar1 ^ 0x80000000;
            lVar3 = lVar3 + 8;
          } while (lVar3 != 0x18);
        }
        if ((local_a8.c_ < 4.440892098500626e-16) || (local_f8[0] < local_a8.c_)) break;
        if (uVar11 == 0x10000) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Warning: integration not converge with n = ",0x2b);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          this_01 = (_anonymous_namespace_ *)(ulong)(uint)(int)cVar2;
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        local_198[2] = local_128;
        local_198[0] = local_138;
        local_198[1] = dStack_130;
        local_f8[0] = local_a8.c_;
        local_f8[1] = local_a8.sh2a_.v._M_elems[0];
        local_f8[2] = local_a8.sh2a_.v._M_elems[1];
        bVar18 = uVar11 < 0x8001;
        uVar11 = uVar11 * 2;
      } while (bVar18);
      local_a8.sh2a_.v._M_elems[1] = local_128;
      local_a8.c_ = local_138;
      local_a8.sh2a_.v._M_elems[0] = dStack_130;
      lVar3 = 0;
      do {
        *(ulong *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -8) =
             *(ulong *)((long)local_a8.sh2a_.v._M_elems + lVar3 + -8) ^ 0x8000000000000000;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x18);
      *local_38 = local_a8.c_ / beta.v._M_elems[0];
      lVar5 = 1;
      lVar3 = 0x10;
      pdVar7 = local_38;
      do {
        dVar19 = 0.0;
        lVar14 = 8;
        pdVar16 = pdVar7;
        do {
          dVar19 = dVar19 + *(double *)((long)beta.v._M_elems + lVar14) * *pdVar16;
          pdVar16 = pdVar16 + -1;
          lVar14 = lVar14 + 8;
        } while (lVar3 != lVar14);
        local_38[lVar5] = (local_a8.sh2a_.v._M_elems[lVar5 + -1] - dVar19) / beta.v._M_elems[0];
        lVar5 = lVar5 + 1;
        pdVar7 = pdVar7 + 1;
        lVar3 = 0x18;
      } while (lVar5 != 3);
      return (fvar<double,_2UL> *)local_38;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"beta should be positive");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U infinite(T Ja, T Jb, T Jc, U beta) {
  const unsigned long max_n = 1 << 16;
  typedef T real_t;
  if (Ja * Jb * Jc <= 0)
    throw(std::invalid_argument("Ja * Jb * Jc should be positive"));
  if (beta <= 0)
    throw(std::invalid_argument("beta should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  auto logZ =
      log(real_t(2)) + standards::simpson_2d(func(Ja, Jb, Jc, beta), real_t(0),
                                             real_t(0), 2 * pi, 2 * pi, 8, 8);
  auto pz = logZ;
  auto pe = abs(beta * beta * logZ.derivative(2) / logZ);
  for (unsigned long n = 16; n <= max_n; n *= 2) {
    logZ = log(real_t(2)) + standards::simpson_2d(func(Ja, Jb, Jc, beta),
                                                  real_t(0), real_t(0), 2 * pi,
                                                  2 * pi, n, n);
    auto pn = abs(beta * beta * (logZ - pz).derivative(2) / logZ);
    if (pn < 2 * std::numeric_limits<real_t>::epsilon() || pn > pe)
      break;
    if (n == max_n)
      std::cerr << "Warning: integration not converge with n = " << max_n
                << std::endl;
    pz = logZ;
    pe = pn;
  }
  return -logZ / beta;
}